

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  LogMessage *pLVar6;
  uint8 *puVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int final_byte_count;
  int original_byte_count;
  uint8 *end;
  uint8 *buffer;
  LogMessage local_60;
  ulong local_28;
  size_t size;
  CodedOutputStream *output_local;
  MessageLite *this_local;
  
  size = (size_t)output;
  output_local = (CodedOutputStream *)this;
  iVar3 = (*this->_vptr_MessageLite[0xc])();
  local_28 = CONCAT44(extraout_var,iVar3);
  if (local_28 < 0x80000000) {
    puVar7 = io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance
                       ((CodedOutputStream *)size,iVar3);
    if (puVar7 == (uint8 *)0x0) {
      iVar3 = io::CodedOutputStream::ByteCount((CodedOutputStream *)size);
      (*this->_vptr_MessageLite[0xd])(this,size);
      bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)size);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        iVar4 = io::CodedOutputStream::ByteCount((CodedOutputStream *)size);
        uVar1 = local_28;
        if ((long)(iVar4 - iVar3) != local_28) {
          iVar5 = (*this->_vptr_MessageLite[0xc])();
          anon_unknown_12::ByteSizeConsistencyError
                    (uVar1,CONCAT44(extraout_var_02,iVar5),(long)(iVar4 - iVar3),this);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      bVar2 = io::CodedOutputStream::IsSerializationDeterministic((CodedOutputStream *)size);
      iVar3 = (*this->_vptr_MessageLite[0x10])(this,(ulong)bVar2,puVar7);
      uVar1 = local_28;
      if (CONCAT44(extraout_var_00,iVar3) - (long)puVar7 != local_28) {
        iVar4 = (*this->_vptr_MessageLite[0xc])();
        anon_unknown_12::ByteSizeConsistencyError
                  (uVar1,CONCAT44(extraout_var_01,iVar4),
                   CONCAT44(extraout_var_00,iVar3) - (long)puVar7,this);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0xfc);
    pLVar6 = internal::LogMessage::operator<<(&local_60,"Exceeded maximum protobuf size of 2GB: ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,local_28);
    internal::LogFinisher::operator=((LogFinisher *)((long)&buffer + 3),pLVar6);
    internal::LogMessage::~LogMessage(&local_60);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8* buffer = output->GetDirectBufferForNBytesAndAdvance(size);
  if (buffer != NULL) {
    uint8* end = InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), buffer);
    if (end - buffer != size) {
      ByteSizeConsistencyError(size, ByteSizeLong(), end - buffer, *this);
    }
    return true;
  } else {
    int original_byte_count = output->ByteCount();
    SerializeWithCachedSizes(output);
    if (output->HadError()) {
      return false;
    }
    int final_byte_count = output->ByteCount();

    if (final_byte_count - original_byte_count != size) {
      ByteSizeConsistencyError(size, ByteSizeLong(),
                               final_byte_count - original_byte_count, *this);
    }

    return true;
  }
}